

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::GetTypeInstruction(TypeManager *this,Type *type)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<unsigned_int> init_list_05;
  initializer_list<unsigned_int> init_list_06;
  initializer_list<unsigned_int> init_list_07;
  initializer_list<unsigned_int> init_list_08;
  initializer_list<unsigned_int> init_list_09;
  initializer_list<unsigned_int> init_list_10;
  initializer_list<unsigned_int> init_list_11;
  initializer_list<unsigned_int> init_list_12;
  initializer_list<unsigned_int> init_list_13;
  initializer_list<unsigned_int> init_list_14;
  initializer_list<unsigned_int> init_list_15;
  initializer_list<unsigned_int> init_list_16;
  initializer_list<unsigned_int> init_list_17;
  initializer_list<unsigned_int> init_list_18;
  initializer_list<unsigned_int> init_list_19;
  initializer_list<unsigned_int> init_list_20;
  initializer_list<unsigned_int> init_list_21;
  initializer_list<unsigned_int> init_list_22;
  initializer_list<unsigned_int> init_list_23;
  initializer_list<unsigned_int> init_list_24;
  initializer_list<unsigned_int> init_list_25;
  initializer_list<unsigned_int> init_list_26;
  initializer_list<unsigned_int> init_list_27;
  initializer_list<unsigned_int> init_list_28;
  initializer_list<unsigned_int> init_list_29;
  initializer_list<unsigned_int> init_list_30;
  initializer_list<unsigned_int> init_list_31;
  initializer_list<unsigned_int> init_list_32;
  initializer_list<unsigned_int> init_list_33;
  initializer_list<unsigned_int> init_list_34;
  bool bVar1;
  Kind KVar2;
  int iVar3;
  IRContext *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  string *input;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *pvVar5;
  reference ppTVar6;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  Type *pTVar7;
  iterator_template<spvtools::opt::Instruction> *this_00;
  Instruction *inst;
  Operand *local_1768;
  Operand *local_1738;
  Operand *local_1718;
  Operand *local_1700;
  Operand *local_16e0;
  Operand *local_16c8;
  Operand *local_16b0;
  Operand *local_1690;
  Operand *local_1678;
  Operand *local_1628;
  Operand *local_1608;
  Operand *local_15e8;
  Operand *local_15d0;
  Operand *local_15b0;
  undefined1 local_1598 [16];
  spv_operand_table local_1588;
  spv_opcode_table local_1580;
  SmallVector<unsigned_int,_2UL> local_1578;
  uint32_t local_154c;
  _Invoker_type local_1548;
  _Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false> local_1540;
  SmallVector<unsigned_int,_2UL> local_1538;
  uint32_t local_150c;
  iterator local_1508;
  size_t local_1500;
  SmallVector<unsigned_int,_2UL> local_14f8;
  uint32_t local_14cc;
  iterator local_14c8;
  __node_base_ptr local_14c0;
  SmallVector<unsigned_int,_2UL> local_14b8;
  uint32_t local_148c;
  iterator local_1488;
  __node_base_ptr local_1480;
  SmallVector<unsigned_int,_2UL> local_1478;
  Operand local_1450;
  Operand OStack_1420;
  Operand OStack_13f0;
  Operand OStack_13c0;
  Operand OStack_1390;
  undefined1 local_1360 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1340;
  uint32_t local_1334;
  CooperativeMatrixKHR *pCStack_1330;
  uint32_t component_type_1;
  CooperativeMatrixKHR *coop_mat_1;
  iterator local_1320;
  undefined8 local_1318;
  SmallVector<unsigned_int,_2UL> local_1310;
  uint32_t local_12e4;
  iterator local_12e0;
  undefined8 local_12d8;
  SmallVector<unsigned_int,_2UL> local_12d0;
  uint32_t local_12a4;
  iterator local_12a0;
  undefined8 local_1298;
  SmallVector<unsigned_int,_2UL> local_1290;
  uint32_t local_1264;
  iterator local_1260;
  undefined8 local_1258;
  SmallVector<unsigned_int,_2UL> local_1250;
  Operand local_1228;
  Operand OStack_11f8;
  Operand OStack_11c8;
  Operand OStack_1198;
  undefined1 local_1168 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1148;
  uint32_t local_113c;
  CooperativeMatrixNV *pCStack_1138;
  uint32_t component_type;
  CooperativeMatrixNV *coop_mat;
  iterator local_1128;
  undefined8 local_1120;
  SmallVector<unsigned_int,_2UL> local_1118;
  uint32_t local_10ec;
  iterator local_10e8;
  undefined8 local_10e0;
  SmallVector<unsigned_int,_2UL> local_10d8;
  Operand local_10b0;
  Operand OStack_1080;
  undefined1 local_1050 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1028;
  AccessQualifier local_101c;
  AccessQualifier *local_1018;
  undefined8 local_1010;
  SmallVector<unsigned_int,_2UL> local_1008;
  Operand local_fe0;
  undefined1 local_fb0 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_f90
  ;
  int local_f88;
  Op local_f84;
  IRContext *local_f80;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_f78
  ;
  uint32_t local_f6c;
  iterator local_f68;
  undefined8 local_f60;
  SmallVector<unsigned_int,_2UL> local_f58;
  Operand local_f30;
  uint32_t local_efc;
  Type *pTStack_ef8;
  uint32_t paramater_type_id;
  Type *ty_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4_1;
  iterator local_ed0;
  undefined8 local_ec8;
  SmallVector<unsigned_int,_2UL> local_ec0;
  Operand local_e98;
  uint32_t local_e64;
  Function *pFStack_e60;
  uint32_t return_type_id;
  Function *function;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops_1;
  SmallVector<unsigned_int,_2UL> local_e28;
  StorageClass local_dfc;
  StorageClass *local_df8;
  undefined8 local_df0;
  SmallVector<unsigned_int,_2UL> local_de8;
  Operand local_dc0;
  Operand OStack_d90;
  undefined1 local_d60 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_d40
  ;
  uint32_t local_d34;
  Pointer *pPStack_d30;
  uint32_t subtype_6;
  Pointer *pointer;
  Operand local_d00;
  undefined1 local_cd0 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_cb0
  ;
  undefined1 local_ca8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  Opaque *opaque;
  IRContext *local_c80;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c78
  ;
  uint32_t local_c6c;
  iterator local_c68;
  undefined8 local_c60;
  SmallVector<unsigned_int,_2UL> local_c58;
  Operand local_c30;
  uint32_t local_bfc;
  Type *pTStack_bf8;
  uint32_t member_type_id;
  Type *ty;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4;
  Struct *structTy;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  SmallVector<unsigned_int,_2UL> local_ba0;
  Operand local_b78;
  undefined1 local_b48 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b28
  ;
  uint32_t local_b20;
  uint32_t local_b1c;
  uint32_t subtype_5;
  undefined8 local_b10;
  SmallVector<unsigned_int,_2UL> local_b08;
  uint32_t local_adc;
  iterator local_ad8;
  undefined8 local_ad0;
  SmallVector<unsigned_int,_2UL> local_ac8;
  Operand local_aa0;
  Operand OStack_a70;
  undefined1 local_a40 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a20
  ;
  uint32_t local_a18;
  uint32_t local_a14;
  uint32_t subtype_4;
  undefined8 local_a08;
  SmallVector<unsigned_int,_2UL> local_a00;
  Operand local_9d8;
  undefined1 local_9a8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_988
  ;
  uint32_t local_980;
  AccessQualifier local_97c;
  uint32_t subtype_3;
  undefined8 local_970;
  SmallVector<unsigned_int,_2UL> local_968;
  ImageFormat local_93c;
  ImageFormat *local_938;
  undefined8 local_930;
  SmallVector<unsigned_int,_2UL> local_928;
  uint32_t local_8fc;
  iterator local_8f8;
  undefined8 local_8f0;
  SmallVector<unsigned_int,_2UL> local_8e8;
  uint local_8bc;
  iterator local_8b8;
  undefined8 local_8b0;
  SmallVector<unsigned_int,_2UL> local_8a8;
  uint local_87c;
  iterator local_878;
  undefined8 local_870;
  SmallVector<unsigned_int,_2UL> local_868;
  uint32_t local_83c;
  iterator local_838;
  undefined8 local_830;
  SmallVector<unsigned_int,_2UL> local_828;
  Dim local_7fc;
  Dim *local_7f8;
  undefined8 local_7f0;
  SmallVector<unsigned_int,_2UL> local_7e8;
  uint32_t local_7bc;
  iterator local_7b8;
  undefined8 local_7b0;
  SmallVector<unsigned_int,_2UL> local_7a8;
  Operand local_780;
  Operand OStack_750;
  Operand OStack_720;
  Operand OStack_6f0;
  Operand OStack_6c0;
  Operand OStack_690;
  Operand OStack_660;
  Operand OStack_630;
  undefined1 local_600 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_5e0
  ;
  uint32_t local_5d4;
  Image *pIStack_5d0;
  uint32_t subtype_2;
  Image *image;
  iterator local_5c0;
  undefined8 local_5b8;
  SmallVector<unsigned_int,_2UL> local_5b0;
  uint32_t local_584;
  iterator local_580;
  undefined8 local_578;
  SmallVector<unsigned_int,_2UL> local_570;
  Operand local_548;
  Operand OStack_518;
  undefined1 local_4e8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_4c8
  ;
  uint32_t local_4c0;
  uint32_t local_4bc;
  uint32_t subtype_1;
  undefined8 local_4b0;
  SmallVector<unsigned_int,_2UL> local_4a8;
  uint32_t local_47c;
  iterator local_478;
  undefined8 local_470;
  SmallVector<unsigned_int,_2UL> local_468;
  Operand local_440;
  Operand OStack_410;
  undefined1 local_3e0 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_3c0
  ;
  uint32_t local_3b8;
  uint32_t local_3b4;
  uint32_t subtype;
  undefined8 local_3a8;
  SmallVector<unsigned_int,_2UL> local_3a0;
  Operand local_378;
  undefined1 local_348 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_328
  ;
  uint local_31c;
  iterator local_318;
  undefined8 local_310;
  SmallVector<unsigned_int,_2UL> local_308;
  uint32_t local_2dc;
  iterator local_2d8;
  undefined8 local_2d0;
  SmallVector<unsigned_int,_2UL> local_2c8;
  Operand local_2a0;
  Operand OStack_270;
  undefined1 local_240 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_220
  ;
  initializer_list<spvtools::opt::Operand> local_218;
  int local_208;
  Op local_204;
  IRContext *local_200;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1f8
  ;
  initializer_list<spvtools::opt::Operand> local_1f0;
  int local_1e0;
  Op local_1dc;
  IRContext *local_1d8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1d0
  ;
  initializer_list<spvtools::opt::Operand> local_1c8;
  int local_1b8;
  Op local_1b4;
  IRContext *local_1b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1a8
  ;
  initializer_list<spvtools::opt::Operand> local_1a0;
  int local_190;
  Op local_18c;
  IRContext *local_188;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_180
  ;
  initializer_list<spvtools::opt::Operand> local_178;
  int local_168;
  Op local_164;
  IRContext *local_160;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_158
  ;
  initializer_list<spvtools::opt::Operand> local_150;
  int local_140;
  Op local_13c;
  IRContext *local_138;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_130
  ;
  initializer_list<spvtools::opt::Operand> local_128;
  int local_118;
  Op local_114;
  IRContext *local_110;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_108
  ;
  initializer_list<spvtools::opt::Operand> local_100;
  int local_f0;
  Op local_ec;
  IRContext *local_e8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_e0;
  initializer_list<spvtools::opt::Operand> local_d8;
  int local_c8;
  Op local_c4;
  IRContext *local_c0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b8;
  initializer_list<spvtools::opt::Operand> local_b0;
  int local_a0;
  Op local_9c;
  IRContext *local_98;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_90;
  initializer_list<spvtools::opt::Operand> local_88;
  int local_78;
  Op local_74;
  IRContext *local_70;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_68;
  initializer_list<spvtools::opt::Operand> local_60;
  int local_50;
  Op local_4c;
  IRContext *local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  int local_34;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> typeInst;
  uint32_t id;
  Type *type_local;
  TypeManager *this_local;
  
  typeInst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = GetId(this,type);
  if (typeInst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ != 0) {
    return typeInst._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  }
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30);
  pIVar4 = context(this);
  typeInst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       IRContext::TakeNextId(pIVar4);
  if (typeInst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
    this_local._4_4_ = 0;
    local_34 = 1;
    goto LAB_0026f341;
  }
  RegisterType(this,typeInst._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_,
               type);
  KVar2 = Type::kind(type);
  switch(KVar2) {
  case kVoid:
    local_48 = context(this);
    local_4c = OpTypeVoid;
    local_50 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_60);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_40,&local_48,&local_4c,&local_50,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_60);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_40);
    break;
  case kBool:
    local_70 = context(this);
    local_74 = OpTypeBool;
    local_78 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_88);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_68,&local_70,&local_74,&local_78,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_88);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_68);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_68);
    break;
  case kInteger:
    local_240._24_8_ = context(this);
    local_240._20_4_ = 0x15;
    local_240._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[10])();
    local_2dc = Integer::width((Integer *)CONCAT44(extraout_var,iVar3));
    local_2d8 = &local_2dc;
    local_2d0 = 1;
    init_list_34._M_len = 1;
    init_list_34._M_array = local_2d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c8,init_list_34);
    Operand::Operand(&local_2a0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_2c8);
    iVar3 = (*type->_vptr_Type[10])();
    bVar1 = Integer::IsSigned((Integer *)CONCAT44(extraout_var_00,iVar3));
    local_31c = (uint)bVar1;
    local_318 = &local_31c;
    local_310 = 1;
    init_list_33._M_len = 1;
    init_list_33._M_array = local_318;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_308,init_list_33);
    Operand::Operand(&OStack_270,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_308);
    local_240._0_8_ = &local_2a0;
    local_240._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_220,(IRContext **)(local_240 + 0x18),(Op *)(local_240 + 0x14),
               (int *)(local_240 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_240);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_220);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_220);
    local_15b0 = (Operand *)local_240;
    do {
      local_15b0 = local_15b0 + -1;
      Operand::~Operand(local_15b0);
    } while (local_15b0 != &local_2a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_308);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c8);
    break;
  case kFloat:
    local_348._24_8_ = context(this);
    local_348._20_4_ = 0x16;
    local_348._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[0xc])();
    local_3b4 = Float::width((Float *)CONCAT44(extraout_var_01,iVar3));
    _subtype = &local_3b4;
    local_3a8 = 1;
    init_list_32._M_len = 1;
    init_list_32._M_array = _subtype;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3a0,init_list_32);
    Operand::Operand(&local_378,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_3a0);
    local_348._0_8_ = &local_378;
    local_348._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_328,(IRContext **)(local_348 + 0x18),(Op *)(local_348 + 0x14),
               (int *)(local_348 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_348);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_328);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_328);
    local_15d0 = (Operand *)local_348;
    do {
      local_15d0 = local_15d0 + -1;
      Operand::~Operand(local_15d0);
    } while (local_15d0 != &local_378);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3a0);
    break;
  case kVector:
    iVar3 = (*type->_vptr_Type[0xe])();
    pTVar7 = Vector::element_type((Vector *)CONCAT44(extraout_var_02,iVar3));
    local_3b8 = GetTypeInstruction(this,pTVar7);
    if (local_3b8 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_3e0._24_8_ = context(this);
    local_3e0._20_4_ = 0x17;
    local_3e0._16_4_ = 0;
    local_47c = local_3b8;
    local_478 = &local_47c;
    local_470 = 1;
    init_list_31._M_len = 1;
    init_list_31._M_array = local_478;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_468,init_list_31);
    Operand::Operand(&local_440,SPV_OPERAND_TYPE_ID,&local_468);
    iVar3 = (*type->_vptr_Type[0xe])();
    local_4bc = Vector::element_count((Vector *)CONCAT44(extraout_var_03,iVar3));
    _subtype_1 = &local_4bc;
    local_4b0 = 1;
    init_list_30._M_len = 1;
    init_list_30._M_array = _subtype_1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_4a8,init_list_30);
    Operand::Operand(&OStack_410,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_4a8);
    local_3e0._0_8_ = &local_440;
    local_3e0._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_3c0,(IRContext **)(local_3e0 + 0x18),(Op *)(local_3e0 + 0x14),
               (int *)(local_3e0 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_3e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_3c0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_3c0);
    local_15e8 = (Operand *)local_3e0;
    do {
      local_15e8 = local_15e8 + -1;
      Operand::~Operand(local_15e8);
    } while (local_15e8 != &local_440);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_4a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_468);
    break;
  case kMatrix:
    iVar3 = (*type->_vptr_Type[0x10])();
    pTVar7 = Matrix::element_type((Matrix *)CONCAT44(extraout_var_04,iVar3));
    local_4c0 = GetTypeInstruction(this,pTVar7);
    if (local_4c0 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_4e8._24_8_ = context(this);
    local_4e8._20_4_ = 0x18;
    local_4e8._16_4_ = 0;
    local_584 = local_4c0;
    local_580 = &local_584;
    local_578 = 1;
    init_list_29._M_len = 1;
    init_list_29._M_array = local_580;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_570,init_list_29);
    Operand::Operand(&local_548,SPV_OPERAND_TYPE_ID,&local_570);
    iVar3 = (*type->_vptr_Type[0x10])();
    image._4_4_ = Matrix::element_count((Matrix *)CONCAT44(extraout_var_05,iVar3));
    local_5c0 = (iterator)((long)&image + 4);
    local_5b8 = 1;
    init_list_28._M_len = 1;
    init_list_28._M_array = local_5c0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_5b0,init_list_28);
    Operand::Operand(&OStack_518,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_5b0);
    local_4e8._0_8_ = &local_548;
    local_4e8._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_4c8,(IRContext **)(local_4e8 + 0x18),(Op *)(local_4e8 + 0x14),
               (int *)(local_4e8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_4e8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_4c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_4c8);
    local_1608 = (Operand *)local_4e8;
    do {
      local_1608 = local_1608 + -1;
      Operand::~Operand(local_1608);
    } while (local_1608 != &local_548);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_5b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_570);
    break;
  case kImage:
    iVar3 = (*type->_vptr_Type[0x12])();
    pIStack_5d0 = (Image *)CONCAT44(extraout_var_06,iVar3);
    pTVar7 = Image::sampled_type(pIStack_5d0);
    local_5d4 = GetTypeInstruction(this,pTVar7);
    if (local_5d4 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_600._24_8_ = context(this);
    local_600._20_4_ = 0x19;
    local_600._16_4_ = 0;
    local_7bc = local_5d4;
    local_7b8 = &local_7bc;
    local_7b0 = 1;
    init_list_27._M_len = 1;
    init_list_27._M_array = local_7b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_7a8,init_list_27);
    Operand::Operand(&local_780,SPV_OPERAND_TYPE_ID,&local_7a8);
    local_7fc = Image::dim(pIStack_5d0);
    local_7f8 = &local_7fc;
    local_7f0 = 1;
    init_list_26._M_len = 1;
    init_list_26._M_array = local_7f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_7e8,init_list_26);
    Operand::Operand(&OStack_750,SPV_OPERAND_TYPE_DIMENSIONALITY,&local_7e8);
    local_83c = Image::depth(pIStack_5d0);
    local_838 = &local_83c;
    local_830 = 1;
    init_list_25._M_len = 1;
    init_list_25._M_array = local_838;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_828,init_list_25);
    Operand::Operand(&OStack_720,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_828);
    bVar1 = Image::is_arrayed(pIStack_5d0);
    local_87c = (uint)bVar1;
    local_878 = &local_87c;
    local_870 = 1;
    init_list_24._M_len = 1;
    init_list_24._M_array = local_878;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_868,init_list_24);
    Operand::Operand(&OStack_6f0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_868);
    bVar1 = Image::is_multisampled(pIStack_5d0);
    local_8bc = (uint)bVar1;
    local_8b8 = &local_8bc;
    local_8b0 = 1;
    init_list_23._M_len = 1;
    init_list_23._M_array = local_8b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_8a8,init_list_23);
    Operand::Operand(&OStack_6c0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_8a8);
    local_8fc = Image::sampled(pIStack_5d0);
    local_8f8 = &local_8fc;
    local_8f0 = 1;
    init_list_22._M_len = 1;
    init_list_22._M_array = local_8f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_8e8,init_list_22);
    Operand::Operand(&OStack_690,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_8e8);
    local_93c = Image::format(pIStack_5d0);
    local_938 = &local_93c;
    local_930 = 1;
    init_list_21._M_len = 1;
    init_list_21._M_array = local_938;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_928,init_list_21);
    Operand::Operand(&OStack_660,SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,&local_928);
    local_97c = Image::access_qualifier(pIStack_5d0);
    _subtype_3 = &local_97c;
    local_970 = 1;
    init_list_20._M_len = 1;
    init_list_20._M_array = _subtype_3;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_968,init_list_20);
    Operand::Operand(&OStack_630,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,&local_968);
    local_600._0_8_ = &local_780;
    local_600._8_8_ = (_func_int **)0x8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_5e0,(IRContext **)(local_600 + 0x18),(Op *)(local_600 + 0x14),
               (int *)(local_600 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_600);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_5e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_5e0);
    local_1628 = (Operand *)local_600;
    do {
      local_1628 = local_1628 + -1;
      Operand::~Operand(local_1628);
    } while (local_1628 != &local_780);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_968);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_928);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_8e8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_8a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_868);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_828);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_7e8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_7a8);
    break;
  case kSampler:
    local_98 = context(this);
    local_9c = OpTypeSampler;
    local_a0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_b0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_90,&local_98,&local_9c,&local_a0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_b0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_90);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_90);
    break;
  case kSampledImage:
    iVar3 = (*type->_vptr_Type[0x16])();
    pTVar7 = SampledImage::image_type((SampledImage *)CONCAT44(extraout_var_07,iVar3));
    local_980 = GetTypeInstruction(this,pTVar7);
    if (local_980 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_9a8._24_8_ = context(this);
    local_9a8._20_4_ = 0x1b;
    local_9a8._16_4_ = 0;
    local_a14 = local_980;
    _subtype_4 = &local_a14;
    local_a08 = 1;
    init_list_19._M_len = 1;
    init_list_19._M_array = _subtype_4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a00,init_list_19);
    Operand::Operand(&local_9d8,SPV_OPERAND_TYPE_ID,&local_a00);
    local_9a8._0_8_ = &local_9d8;
    local_9a8._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_988,(IRContext **)(local_9a8 + 0x18),(Op *)(local_9a8 + 0x14),
               (int *)(local_9a8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_9a8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_988);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_988);
    local_1678 = (Operand *)local_9a8;
    do {
      local_1678 = local_1678 + -1;
      Operand::~Operand(local_1678);
    } while (local_1678 != &local_9d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a00);
    break;
  case kArray:
    iVar3 = (*type->_vptr_Type[0x18])();
    pTVar7 = Array::element_type((Array *)CONCAT44(extraout_var_08,iVar3));
    local_a18 = GetTypeInstruction(this,pTVar7);
    if (local_a18 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_a40._24_8_ = context(this);
    local_a40._20_4_ = 0x1c;
    local_a40._16_4_ = 0;
    local_adc = local_a18;
    local_ad8 = &local_adc;
    local_ad0 = 1;
    init_list_18._M_len = 1;
    init_list_18._M_array = local_ad8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ac8,init_list_18);
    Operand::Operand(&local_aa0,SPV_OPERAND_TYPE_ID,&local_ac8);
    iVar3 = (*type->_vptr_Type[0x18])();
    local_b1c = Array::LengthId((Array *)CONCAT44(extraout_var_09,iVar3));
    _subtype_5 = &local_b1c;
    local_b10 = 1;
    init_list_17._M_len = 1;
    init_list_17._M_array = _subtype_5;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b08,init_list_17);
    Operand::Operand(&OStack_a70,SPV_OPERAND_TYPE_ID,&local_b08);
    local_a40._0_8_ = &local_aa0;
    local_a40._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_a20,(IRContext **)(local_a40 + 0x18),(Op *)(local_a40 + 0x14),
               (int *)(local_a40 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_a40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_a20);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_a20);
    local_1690 = (Operand *)local_a40;
    do {
      local_1690 = local_1690 + -1;
      Operand::~Operand(local_1690);
    } while (local_1690 != &local_aa0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b08);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ac8);
    break;
  case kRuntimeArray:
    iVar3 = (*type->_vptr_Type[0x1a])();
    pTVar7 = RuntimeArray::element_type((RuntimeArray *)CONCAT44(extraout_var_10,iVar3));
    local_b20 = GetTypeInstruction(this,pTVar7);
    if (local_b20 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_b48._24_8_ = context(this);
    local_b48._20_4_ = 0x1d;
    local_b48._16_4_ = 0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_b20;
    init_list_16._M_len = 1;
    init_list_16._M_array =
         (iterator)
         ((long)&ops.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ba0,init_list_16);
    Operand::Operand(&local_b78,SPV_OPERAND_TYPE_ID,&local_ba0);
    local_b48._0_8_ = &local_b78;
    local_b48._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b28,(IRContext **)(local_b48 + 0x18),(Op *)(local_b48 + 0x14),
               (int *)(local_b48 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_b48);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_b28);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_b28);
    local_16b0 = (Operand *)local_b48;
    do {
      local_16b0 = local_16b0 + -1;
      Operand::~Operand(local_16b0);
    } while (local_16b0 != &local_b78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ba0);
    break;
  case kStruct:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    iVar3 = (*type->_vptr_Type[0x1c])();
    pvVar5 = Struct::element_types((Struct *)CONCAT44(extraout_var_11,iVar3));
    __end4 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::begin(pvVar5);
    ty = (Type *)std::
                 vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                       *)&ty), bVar1) {
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                ::operator*(&__end4);
      pTStack_bf8 = *ppTVar6;
      local_bfc = GetTypeInstruction(this,pTStack_bf8);
      if (local_bfc == 0) {
        this_local._4_4_ = 0;
        local_34 = 1;
        goto LAB_0026e2e4;
      }
      local_c68 = &local_c6c;
      local_c60 = 1;
      init_list_15._M_len = 1;
      init_list_15._M_array = local_c68;
      local_c6c = local_bfc;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c58,init_list_15);
      Operand::Operand(&local_c30,SPV_OPERAND_TYPE_ID,&local_c58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &structTy,&local_c30);
      Operand::~Operand(&local_c30);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c58);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end4);
    }
    local_c80 = context(this);
    opaque._4_4_ = 0x1e;
    opaque._0_4_ = 0;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
              ((spvtools *)&local_c78,&local_c80,(Op *)((long)&opaque + 4),(int *)&opaque,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_c78);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_c78);
    local_34 = 2;
LAB_0026e2e4:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    goto joined_r0x0026e8f1;
  case kOpaque:
    iVar3 = (*type->_vptr_Type[0x1e])();
    words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_12,iVar3);
    input = Opaque::name_abi_cxx11_
                      ((Opaque *)
                       words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8,input);
    local_cd0._24_8_ = context(this);
    local_cd0._20_4_ = 0x1f;
    local_cd0._16_4_ = 0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&pointer,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8);
    Operand::Operand(&local_d00,SPV_OPERAND_TYPE_LITERAL_STRING,(OperandData *)&pointer);
    local_cd0._0_8_ = &local_d00;
    local_cd0._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_cb0,(IRContext **)(local_cd0 + 0x18),(Op *)(local_cd0 + 0x14),
               (int *)(local_cd0 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_cd0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_cb0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_cb0);
    local_16c8 = (Operand *)local_cd0;
    do {
      local_16c8 = local_16c8 + -1;
      Operand::~Operand(local_16c8);
    } while (local_16c8 != &local_d00);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&pointer);
    local_34 = 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8);
    break;
  case kPointer:
    iVar3 = (*type->_vptr_Type[0x20])();
    pPStack_d30 = (Pointer *)CONCAT44(extraout_var_13,iVar3);
    pTVar7 = Pointer::pointee_type(pPStack_d30);
    local_d34 = GetTypeInstruction(this,pTVar7);
    if (local_d34 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_d60._24_8_ = context(this);
    local_d60._20_4_ = 0x20;
    local_d60._16_4_ = 0;
    local_dfc = Pointer::storage_class(pPStack_d30);
    local_df8 = &local_dfc;
    local_df0 = 1;
    init_list_14._M_len = 1;
    init_list_14._M_array = local_df8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_de8,init_list_14);
    Operand::Operand(&local_dc0,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_de8);
    ops_1.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_d34;
    init_list_13._M_len = 1;
    init_list_13._M_array =
         (iterator)
         ((long)&ops_1.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e28,init_list_13);
    Operand::Operand(&OStack_d90,SPV_OPERAND_TYPE_ID,&local_e28);
    local_d60._0_8_ = &local_dc0;
    local_d60._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_d40,(IRContext **)(local_d60 + 0x18),(Op *)(local_d60 + 0x14),
               (int *)(local_d60 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_d60);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_d40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_d40);
    local_16e0 = (Operand *)local_d60;
    do {
      local_16e0 = local_16e0 + -1;
      Operand::~Operand(local_16e0);
    } while (local_16e0 != &local_dc0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_de8);
    break;
  case kFunction:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&function)
    ;
    iVar3 = (*type->_vptr_Type[0x22])();
    pFStack_e60 = (Function *)CONCAT44(extraout_var_14,iVar3);
    pTVar7 = Function::return_type(pFStack_e60);
    local_e64 = GetTypeInstruction(this,pTVar7);
    if (local_e64 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
    }
    else {
      local_ed0 = (iterator)((long)&__range4_1 + 4);
      local_ec8 = 1;
      init_list_12._M_len = 1;
      init_list_12._M_array = local_ed0;
      __range4_1._4_4_ = local_e64;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ec0,init_list_12);
      Operand::Operand(&local_e98,SPV_OPERAND_TYPE_ID,&local_ec0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &function,&local_e98);
      Operand::~Operand(&local_e98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ec0);
      pvVar5 = Function::param_types(pFStack_e60);
      __end4_1 = std::
                 vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ::begin(pvVar5);
      ty_1 = (Type *)std::
                     vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     ::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                 *)&ty_1), bVar1) {
        ppTVar6 = __gnu_cxx::
                  __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                  ::operator*(&__end4_1);
        pTStack_ef8 = *ppTVar6;
        local_efc = GetTypeInstruction(this,pTStack_ef8);
        if (local_efc == 0) {
          this_local._4_4_ = 0;
          local_34 = 1;
          goto LAB_0026e8df;
        }
        local_f68 = &local_f6c;
        local_f60 = 1;
        init_list_11._M_len = 1;
        init_list_11._M_array = local_f68;
        local_f6c = local_efc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f58,init_list_11);
        Operand::Operand(&local_f30,SPV_OPERAND_TYPE_ID,&local_f58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &function,&local_f30);
        Operand::~Operand(&local_f30);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f58);
        __gnu_cxx::
        __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
        ::operator++(&__end4_1);
      }
      local_f80 = context(this);
      local_f84 = OpTypeFunction;
      local_f88 = 0;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
                ((spvtools *)&local_f78,&local_f80,&local_f84,&local_f88,
                 (uint *)((long)&typeInst._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                 _M_head_impl + 4),
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &function);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::operator=(&local_30,&local_f78);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_f78);
      local_34 = 2;
    }
LAB_0026e8df:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&function)
    ;
joined_r0x0026e8f1:
    if (local_34 != 2) goto LAB_0026f341;
    break;
  case kEvent:
    local_c0 = context(this);
    local_c4 = OpTypeEvent;
    local_c8 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_d8);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b8,&local_c0,&local_c4,&local_c8,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_d8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_b8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_b8);
    break;
  case kDeviceEvent:
    local_e8 = context(this);
    local_ec = OpTypeDeviceEvent;
    local_f0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_100);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_e0,&local_e8,&local_ec,&local_f0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_100);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_e0);
    break;
  case kReserveId:
    local_110 = context(this);
    local_114 = OpTypeReserveId;
    local_118 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_128);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_108,&local_110,&local_114,&local_118,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_128);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_108);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_108);
    break;
  case kQueue:
    local_138 = context(this);
    local_13c = OpTypeQueue;
    local_140 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_150);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_130,&local_138,&local_13c,&local_140,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_150);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_130);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_130);
    break;
  case kPipe:
    local_fb0._24_8_ = context(this);
    local_fb0._20_4_ = 0x26;
    local_fb0._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[0x2c])();
    local_101c = Pipe::access_qualifier((Pipe *)CONCAT44(extraout_var_15,iVar3));
    local_1018 = &local_101c;
    local_1010 = 1;
    init_list_10._M_len = 1;
    init_list_10._M_array = local_1018;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1008,init_list_10);
    Operand::Operand(&local_fe0,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,&local_1008);
    local_fb0._0_8_ = &local_fe0;
    local_fb0._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_f90,(IRContext **)(local_fb0 + 0x18),(Op *)(local_fb0 + 0x14),
               (int *)(local_fb0 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_fb0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_f90);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_f90);
    local_1700 = (Operand *)local_fb0;
    do {
      local_1700 = local_1700 + -1;
      Operand::~Operand(local_1700);
    } while (local_1700 != &local_fe0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1008);
    break;
  case kForwardPointer:
    local_1050._32_8_ = context(this);
    local_1050[0x1c] = '\'';
    local_1050[0x1d] = '\0';
    local_1050[0x1e] = '\0';
    local_1050[0x1f] = '\0';
    local_1050[0x18] = '\0';
    local_1050[0x19] = '\0';
    local_1050[0x1a] = '\0';
    local_1050[0x1b] = '\0';
    local_1050._20_4_ = 0;
    iVar3 = (*type->_vptr_Type[0x2e])();
    local_10ec = ForwardPointer::target_id((ForwardPointer *)CONCAT44(extraout_var_16,iVar3));
    local_10e8 = &local_10ec;
    local_10e0 = 1;
    init_list_09._M_len = 1;
    init_list_09._M_array = local_10e8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_10d8,init_list_09);
    Operand::Operand(&local_10b0,SPV_OPERAND_TYPE_ID,&local_10d8);
    iVar3 = (*type->_vptr_Type[0x2e])();
    coop_mat._4_4_ =
         ForwardPointer::storage_class((ForwardPointer *)CONCAT44(extraout_var_17,iVar3));
    local_1128 = (iterator)((long)&coop_mat + 4);
    local_1120 = 1;
    init_list_08._M_len = 1;
    init_list_08._M_array = local_1128;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1118,init_list_08);
    Operand::Operand(&OStack_1080,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_1118);
    local_1050._0_8_ = &local_10b0;
    local_1050._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1028,(IRContext **)(local_1050 + 0x20),(Op *)(local_1050 + 0x1c),
               (int *)(local_1050 + 0x18),(int *)(local_1050 + 0x14),
               (initializer_list<spvtools::opt::Operand> *)local_1050);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1028);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1028);
    local_1718 = (Operand *)local_1050;
    do {
      local_1718 = local_1718 + -1;
      Operand::~Operand(local_1718);
    } while (local_1718 != &local_10b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1118);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_10d8);
    break;
  case kPipeStorage:
    local_160 = context(this);
    local_164 = OpTypePipeStorage;
    local_168 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_178);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_158,&local_160,&local_164,&local_168,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_178);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_158);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_158);
    break;
  case kNamedBarrier:
    local_188 = context(this);
    local_18c = OpTypeNamedBarrier;
    local_190 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1a0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_180,&local_188,&local_18c,&local_190,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1a0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_180);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_180);
    break;
  case kAccelerationStructureNV:
    local_1b0 = context(this);
    local_1b4 = OpTypeAccelerationStructureKHR;
    local_1b8 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1c8);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1a8,&local_1b0,&local_1b4,&local_1b8,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1a8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1a8);
    break;
  case kCooperativeMatrixNV:
    iVar3 = (*type->_vptr_Type[0x36])();
    pCStack_1138 = (CooperativeMatrixNV *)CONCAT44(extraout_var_18,iVar3);
    pTVar7 = CooperativeMatrixNV::component_type(pCStack_1138);
    local_113c = GetTypeInstruction(this,pTVar7);
    if (local_113c == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_1168._24_8_ = context(this);
    local_1168._20_4_ = 0x14ee;
    local_1168._16_4_ = 0;
    local_1264 = local_113c;
    local_1260 = &local_1264;
    local_1258 = 1;
    init_list_07._M_len = 1;
    init_list_07._M_array = local_1260;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1250,init_list_07);
    Operand::Operand(&local_1228,SPV_OPERAND_TYPE_ID,&local_1250);
    local_12a4 = CooperativeMatrixNV::scope_id(pCStack_1138);
    local_12a0 = &local_12a4;
    local_1298 = 1;
    init_list_06._M_len = 1;
    init_list_06._M_array = local_12a0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1290,init_list_06);
    Operand::Operand(&OStack_11f8,SPV_OPERAND_TYPE_SCOPE_ID,&local_1290);
    local_12e4 = CooperativeMatrixNV::rows_id(pCStack_1138);
    local_12e0 = &local_12e4;
    local_12d8 = 1;
    init_list_05._M_len = 1;
    init_list_05._M_array = local_12e0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_12d0,init_list_05);
    Operand::Operand(&OStack_11c8,SPV_OPERAND_TYPE_ID,&local_12d0);
    coop_mat_1._4_4_ = CooperativeMatrixNV::columns_id(pCStack_1138);
    local_1320 = (iterator)((long)&coop_mat_1 + 4);
    local_1318 = 1;
    init_list_04._M_len = 1;
    init_list_04._M_array = local_1320;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1310,init_list_04);
    Operand::Operand(&OStack_1198,SPV_OPERAND_TYPE_ID,&local_1310);
    local_1168._0_8_ = &local_1228;
    local_1168._8_8_ = (_func_int **)0x4;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1148,(IRContext **)(local_1168 + 0x18),(Op *)(local_1168 + 0x14),
               (int *)(local_1168 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1168);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1148);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1148);
    local_1738 = (Operand *)local_1168;
    do {
      local_1738 = local_1738 + -1;
      Operand::~Operand(local_1738);
    } while (local_1738 != &local_1228);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1310);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_12d0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1290);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1250);
    break;
  case kCooperativeMatrixKHR:
    iVar3 = (*type->_vptr_Type[0x38])();
    pCStack_1330 = (CooperativeMatrixKHR *)CONCAT44(extraout_var_19,iVar3);
    pTVar7 = CooperativeMatrixKHR::component_type(pCStack_1330);
    local_1334 = GetTypeInstruction(this,pTVar7);
    if (local_1334 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_0026f341;
    }
    local_1360._24_8_ = context(this);
    local_1360[0x14] = true;
    local_1360[0x15] = true;
    local_1360._22_2_ = 0;
    local_1360._16_4_ = 0;
    local_148c = local_1334;
    local_1488 = &local_148c;
    local_1480 = (__node_base_ptr)0x1;
    init_list_03._M_len = 1;
    init_list_03._M_array = local_1488;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1478,init_list_03);
    Operand::Operand(&local_1450,SPV_OPERAND_TYPE_ID,&local_1478);
    local_14cc = CooperativeMatrixKHR::scope_id(pCStack_1330);
    local_14c8 = &local_14cc;
    local_14c0 = (__node_base_ptr)0x1;
    init_list_02._M_len = 1;
    init_list_02._M_array = local_14c8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_14b8,init_list_02);
    Operand::Operand(&OStack_1420,SPV_OPERAND_TYPE_SCOPE_ID,&local_14b8);
    local_150c = CooperativeMatrixKHR::rows_id(pCStack_1330);
    local_1508 = &local_150c;
    local_1500 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = local_1508;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_14f8,init_list_01);
    Operand::Operand(&OStack_13f0,SPV_OPERAND_TYPE_ID,&local_14f8);
    local_154c = CooperativeMatrixKHR::columns_id(pCStack_1330);
    local_1548 = (_Invoker_type)&local_154c;
    local_1540._M_head_impl = (DefUseManager *)0x1;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_1548;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1538,init_list_00);
    Operand::Operand(&OStack_13c0,SPV_OPERAND_TYPE_ID,&local_1538);
    local_1598._12_4_ = CooperativeMatrixKHR::use_id(pCStack_1330);
    local_1588 = (spv_operand_table)(local_1598 + 0xc);
    local_1580 = (spv_opcode_table)0x1;
    init_list._M_len = 1;
    init_list._M_array = (iterator)local_1588;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1578,init_list);
    Operand::Operand(&OStack_1390,SPV_OPERAND_TYPE_ID,&local_1578);
    local_1360._0_8_ = &local_1450;
    local_1360._8_8_ =
         (__uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
          )0x5;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1340,(IRContext **)(local_1360 + 0x18),(Op *)(local_1360 + 0x14),
               (int *)(local_1360 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1360);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1340);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1340);
    local_1768 = (Operand *)local_1360;
    do {
      local_1768 = local_1768 + -1;
      Operand::~Operand(local_1768);
    } while (local_1768 != &local_1450);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1578);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1538);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_14f8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_14b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1478);
    break;
  case kRayQueryKHR:
    local_1d8 = context(this);
    local_1dc = OpTypeRayQueryKHR;
    local_1e0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1f0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1d0,&local_1d8,&local_1dc,&local_1e0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1f0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1d0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1d0);
    break;
  case kHitObjectNV:
    local_200 = context(this);
    local_204 = OpTypeHitObjectNV;
    local_208 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_218);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1f8,&local_200,&local_204,&local_208,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_218);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1f8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1f8);
    break;
  default:
    __assert_fail("false && \"Unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x1bd,
                  "uint32_t spvtools::opt::analysis::TypeManager::GetTypeInstruction(const Type *)")
    ;
  }
  pIVar4 = context(this);
  IRContext::AddType(pIVar4,&local_30);
  pIVar4 = context(this);
  context(this);
  IRContext::types_values_end((IRContext *)local_1598);
  this_00 = &InstructionList::iterator::operator--((iterator *)local_1598)->super_iterator;
  inst = utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(this_00);
  IRContext::AnalyzeDefUse(pIVar4,inst);
  AttachDecorations(this,typeInst._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl.
                         _4_4_,type);
  this_local._4_4_ =
       typeInst._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_34 = 1;
LAB_0026f341:
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return this_local._4_4_;
}

Assistant:

uint32_t TypeManager::GetTypeInstruction(const Type* type) {
  uint32_t id = GetId(type);
  if (id != 0) return id;

  std::unique_ptr<Instruction> typeInst;
  // TODO(1841): Handle id overflow.
  id = context()->TakeNextId();
  if (id == 0) {
    return 0;
  }

  RegisterType(id, *type);
  switch (type->kind()) {
#define DefineParameterlessCase(kind)                                         \
  case Type::k##kind:                                                         \
    typeInst = MakeUnique<Instruction>(context(), spv::Op::OpType##kind, 0,   \
                                       id, std::initializer_list<Operand>{}); \
    break
    DefineParameterlessCase(Void);
    DefineParameterlessCase(Bool);
    DefineParameterlessCase(Sampler);
    DefineParameterlessCase(Event);
    DefineParameterlessCase(DeviceEvent);
    DefineParameterlessCase(ReserveId);
    DefineParameterlessCase(Queue);
    DefineParameterlessCase(PipeStorage);
    DefineParameterlessCase(NamedBarrier);
    DefineParameterlessCase(AccelerationStructureNV);
    DefineParameterlessCase(RayQueryKHR);
    DefineParameterlessCase(HitObjectNV);
#undef DefineParameterlessCase
    case Type::kInteger:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeInt, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsInteger()->width()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(type->AsInteger()->IsSigned() ? 1u : 0u)}}});
      break;
    case Type::kFloat:
      // TODO: Handle FP encoding enums once actually used.
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeFloat, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsFloat()->width()}}});
      break;
    case Type::kVector: {
      uint32_t subtype = GetTypeInstruction(type->AsVector()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeVector, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsVector()->element_count()}}});
      break;
    }
    case Type::kMatrix: {
      uint32_t subtype = GetTypeInstruction(type->AsMatrix()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeMatrix, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsMatrix()->element_count()}}});
      break;
    }
    case Type::kImage: {
      const Image* image = type->AsImage();
      uint32_t subtype = GetTypeInstruction(image->sampled_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeImage, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_DIMENSIONALITY,
               {static_cast<uint32_t>(image->dim())}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->depth()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_arrayed() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_multisampled() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->sampled()}},
              {SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,
               {static_cast<uint32_t>(image->format())}},
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(image->access_qualifier())}}});
      break;
    }
    case Type::kSampledImage: {
      uint32_t subtype =
          GetTypeInstruction(type->AsSampledImage()->image_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeSampledImage, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kArray: {
      uint32_t subtype = GetTypeInstruction(type->AsArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeArray, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_ID, {type->AsArray()->LengthId()}}});
      break;
    }
    case Type::kRuntimeArray: {
      uint32_t subtype =
          GetTypeInstruction(type->AsRuntimeArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeRuntimeArray, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kStruct: {
      std::vector<Operand> ops;
      const Struct* structTy = type->AsStruct();
      for (auto ty : structTy->element_types()) {
        uint32_t member_type_id = GetTypeInstruction(ty);
        if (member_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {member_type_id}));
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeStruct, 0, id, ops);
      break;
    }
    case Type::kOpaque: {
      const Opaque* opaque = type->AsOpaque();
      // Convert to null-terminated packed UTF-8 string.
      std::vector<uint32_t> words = spvtools::utils::MakeVector(opaque->name());
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeOpaque, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_STRING, words}});
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer = type->AsPointer();
      uint32_t subtype = GetTypeInstruction(pointer->pointee_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePointer, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(pointer->storage_class())}},
              {SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kFunction: {
      std::vector<Operand> ops;
      const Function* function = type->AsFunction();
      uint32_t return_type_id = GetTypeInstruction(function->return_type());
      if (return_type_id == 0) {
        return 0;
      }
      ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {return_type_id}));
      for (auto ty : function->param_types()) {
        uint32_t paramater_type_id = GetTypeInstruction(ty);
        if (paramater_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {paramater_type_id}));
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeFunction, 0,
                                         id, ops);
      break;
    }
    case Type::kPipe:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePipe, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(type->AsPipe()->access_qualifier())}}});
      break;
    case Type::kForwardPointer:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeForwardPointer, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {type->AsForwardPointer()->target_id()}},
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(
                   type->AsForwardPointer()->storage_class())}}});
      break;
    case Type::kCooperativeMatrixNV: {
      auto coop_mat = type->AsCooperativeMatrixNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}}});
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      auto coop_mat = type->AsCooperativeMatrixKHR();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixKHR, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->use_id()}}});
      break;
    }
    default:
      assert(false && "Unexpected type");
      break;
  }
  context()->AddType(std::move(typeInst));
  context()->AnalyzeDefUse(&*--context()->types_values_end());
  AttachDecorations(id, type);
  return id;
}